

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O2

void onConnect(int fd)

{
  undefined1 ud_ [8];
  Codecc *this;
  undefined1 local_d8 [8];
  string msg;
  Codecc *code;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_60 [8];
  Ptr sc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_40 [8];
  Ptr sendMsg;
  int local_1c [2];
  int fd_local;
  
  local_1c[0] = fd;
  printf("onConnect %d\n",fd);
  hwnet::TCPSocket::New
            ((TCPSocket *)local_60,&poller_,
             pools.super__Vector_base<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>.
             _M_impl.super__Vector_impl_data._M_start
             [(ulong)(long)fd %
              (ulong)((long)pools.
                            super__Vector_base<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)pools.
                            super__Vector_base<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3)],fd);
  this = (Codecc *)operator_new(0x28);
  Codecc::Codecc(this,(long)packetSize);
  ud_ = local_60;
  msg.field_2._8_8_ = this;
  hwnet::any::any<Codecc*>((any *)(local_90 + 0x10),(Codecc **)((long)&msg.field_2 + 8));
  hwnet::TCPSocket::SetUserData((TCPSocket *)local_90,(any *)ud_);
  msg._M_dataplus._M_p = (pointer)0x0;
  local_d8 = (undefined1  [8])onDataClient;
  msg.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long),_void_(*)(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
       ::_M_invoke;
  msg._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long),_void_(*)(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
       ::_M_manager;
  hwnet::TCPSocket::SetRecvCallback((TCPSocket *)local_a0,(RecvCallback *)local_90._0_8_);
  sendMsg.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_40 = (undefined1  [8])onError;
  sendMsg.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int),_void_(*)(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>
       ::_M_manager;
  hwnet::TCPSocket::SetErrorCallback((TCPSocket *)&code,(ErrorCallback *)local_a0._0_8_);
  hwnet::TCPSocket::Start
            ((TCPSocket *)
             &sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Codecc::GetRecvBuffer((Codecc *)(local_90 + 0x20));
  hwnet::TCPSocket::Recv
            ((TCPSocket *)
             CONCAT44(sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._4_4_,
                      sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._0_4_),(Ptr *)(local_90 + 0x20));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
  std::_Function_base::~_Function_base((_Function_base *)local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
  hwnet::any::_destroy((any *)(local_90 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"hello",(allocator<char> *)local_40);
  hwnet::Buffer::New((Buffer *)local_40,0xd,0);
  sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       0x9000000;
  hwnet::Buffer::Append
            ((Buffer *)local_40,
             (char *)&sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,4);
  hwnet::Buffer::Append((Buffer *)local_40,(char *)local_1c,4);
  hwnet::Buffer::Append((Buffer *)local_40,(string *)local_d8);
  hwnet::TCPSocket::Send((TCPSocket *)local_60,(Ptr *)local_40,0);
  LOCK();
  ccount.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((int)ccount.super___atomic_base<int>._M_i + 1);
  UNLOCK();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sendMsg);
  std::__cxx11::string::~string((string *)local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sc);
  return;
}

Assistant:

void onConnect(int fd) {
	printf("onConnect %d\n",fd);
	ThreadPool *t = pools[fd%pools.size()];
	auto sc = TCPSocket::New(&poller_,t,fd);
	auto code = new Codecc(packetSize);
	sc->SetUserData(code)->SetRecvCallback(onDataClient)->SetErrorCallback(onError)->Start()->Recv(code->GetRecvBuffer());
	
	std::string msg = std::string("hello");
	auto sendMsg = Buffer::New(5+4+4);
	int len = 5 + 4;
	len = htonl(len);
	sendMsg->Append((const char *)&len,4);
	sendMsg->Append((const char *)&fd,4);	
	sendMsg->Append(msg);
	sc->Send(sendMsg);
	ccount++;
	
}